

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall cfd::core::Psbt::Join(Psbt *this,Psbt *transaction,bool ignore_duplicate_error)

{
  Transaction local_68;
  wally_psbt *local_28;
  wally_psbt *psbt_pointer;
  Psbt *pPStack_18;
  bool ignore_duplicate_error_local;
  Psbt *transaction_local;
  Psbt *this_local;
  
  psbt_pointer._7_1_ = ignore_duplicate_error;
  pPStack_18 = transaction;
  transaction_local = this;
  local_28 = MergePsbt(this->wally_psbt_pointer_,transaction->wally_psbt_pointer_,
                       ignore_duplicate_error);
  FreeWallyPsbtAddress(this->wally_psbt_pointer_);
  this->wally_psbt_pointer_ = local_28;
  RebuildTransaction(&local_68,this->wally_psbt_pointer_);
  Transaction::operator=(&this->base_tx_,&local_68);
  Transaction::~Transaction(&local_68);
  return;
}

Assistant:

void Psbt::Join(const Psbt &transaction, bool ignore_duplicate_error) {
  struct wally_psbt *psbt_pointer = MergePsbt(
      wally_psbt_pointer_, transaction.wally_psbt_pointer_,
      ignore_duplicate_error);
  FreeWallyPsbtAddress(wally_psbt_pointer_);  // free
  wally_psbt_pointer_ = psbt_pointer;
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}